

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

saucy * saucy_alloc(Abc_Ntk_t *pNtk)

{
  int n;
  uint uVar1;
  uint n_00;
  saucy *s;
  int *piVar2;
  char *pcVar3;
  Vec_Int_t **ppVVar4;
  Vec_Int_t *pVVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  size_t __size;
  ulong uVar8;
  int n_01;
  
  uVar1 = pNtk->vPos->nSize;
  n_00 = pNtk->vPis->nSize;
  s = (saucy *)malloc(0x2b8);
  uVar7 = 0;
  if (s != (saucy *)0x0) {
    n_01 = uVar1 + n_00;
    piVar2 = ints(n_01);
    s->ninduce = piVar2;
    piVar2 = ints(n_01);
    s->sinduce = piVar2;
    pcVar3 = bits(n_01);
    s->indmark = pcVar3;
    piVar2 = zeros(n_01);
    (s->left).cfront = piVar2;
    piVar2 = ints(n_01);
    (s->left).clen = piVar2;
    piVar2 = zeros(n_01);
    (s->right).cfront = piVar2;
    piVar2 = ints(n_01);
    (s->right).clen = piVar2;
    n = n_01 + 1;
    pcVar3 = bits(n);
    s->stuff = pcVar3;
    piVar2 = ints(n_01 + 2);
    s->bucket = piVar2;
    piVar2 = ints(n);
    s->count = piVar2;
    piVar2 = zeros(n_01);
    s->ccount = piVar2;
    piVar2 = ints(n_01);
    s->clist = piVar2;
    piVar2 = ints(n);
    s->nextnon = piVar2 + 1;
    piVar2 = ints(n);
    s->prevnon = piVar2;
    piVar2 = ints(n_01);
    s->anctar = piVar2;
    piVar2 = ints(n_01);
    s->start = piVar2;
    piVar2 = ints(n_01);
    s->gamma = piVar2;
    piVar2 = ints(n_01);
    s->junk = piVar2;
    piVar2 = ints(n_01);
    s->theta = piVar2;
    piVar2 = ints(n_01);
    s->thsize = piVar2;
    piVar2 = ints(n_01);
    (s->left).lab = piVar2;
    piVar2 = ints(n_01);
    (s->left).unlab = piVar2;
    piVar2 = ints(n_01);
    (s->right).lab = piVar2;
    piVar2 = ints(n_01);
    (s->right).unlab = piVar2;
    piVar2 = ints(n_01);
    s->splitvar = piVar2;
    piVar2 = ints(n_01);
    s->splitwho = piVar2;
    piVar2 = ints(n_01);
    s->splitfrom = piVar2;
    piVar2 = ints(n);
    s->splitlev = piVar2;
    piVar2 = ints(n_01);
    s->unsupp = piVar2;
    piVar2 = zeros(n_01);
    s->conncnts = piVar2;
    pcVar3 = bits(n_01);
    s->diffmark = pcVar3;
    piVar2 = ints(n_01);
    s->diffs = piVar2;
    piVar2 = ints(n_01);
    s->difflev = piVar2;
    piVar2 = ints(n_01);
    s->undifflev = piVar2;
    piVar2 = ints(n_01);
    s->specmin = piVar2;
    piVar2 = ints(n_01);
    s->thnext = piVar2;
    piVar2 = ints(n_01);
    s->thprev = piVar2;
    piVar2 = ints(n_01);
    s->threp = piVar2;
    piVar2 = ints(n_01);
    s->thfront = piVar2;
    piVar2 = ints(n_01);
    s->pairs = piVar2;
    piVar2 = ints(n_01);
    s->unpairs = piVar2;
    piVar2 = ints(n_01);
    s->diffnons = piVar2;
    piVar2 = ints(n_01);
    s->undiffnons = piVar2;
    pcVar3 = bits(n_01);
    s->marks = pcVar3;
    ppVVar4 = (Vec_Int_t **)malloc((long)(int)n_00 * 8);
    s->iDep = ppVVar4;
    __size = (long)(int)uVar1 * 8;
    ppVVar4 = (Vec_Int_t **)malloc(__size);
    s->oDep = ppVVar4;
    ppVVar4 = (Vec_Int_t **)malloc((long)(int)n_00 * 8);
    s->obs = ppVVar4;
    ppVVar4 = (Vec_Int_t **)malloc(__size);
    s->ctrl = ppVVar4;
    uVar8 = 0;
    if (0 < (int)n_00) {
      uVar8 = (ulong)n_00;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      pVVar5 = Vec_IntAlloc((int)__size);
      s->iDep[uVar7] = pVVar5;
      pVVar5 = Vec_IntAlloc((int)__size);
      s->obs[uVar7] = pVVar5;
    }
    uVar8 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      pVVar5 = Vec_IntAlloc((int)__size);
      s->oDep[uVar8] = pVVar5;
      pVVar5 = Vec_IntAlloc((int)__size);
      s->ctrl[uVar8] = pVVar5;
    }
    pVVar6 = Vec_PtrAlloc(n_01);
    s->randomVectorArray_sim1 = pVVar6;
    piVar2 = zeros(n_01);
    s->randomVectorSplit_sim1 = piVar2;
    pVVar6 = Vec_PtrAlloc(n_01);
    s->randomVectorArray_sim2 = pVVar6;
    piVar2 = zeros(n_01);
    s->randomVectorSplit_sim2 = piVar2;
    pVVar6 = Vec_PtrAlloc(1);
    s->satCounterExamples = pVVar6;
    piVar2 = ints(n_00);
    s->pModel = piVar2;
    if ((((((s->ninduce != (int *)0x0) && (s->sinduce != (int *)0x0)) &&
          ((s->left).cfront != (int *)0x0)) &&
         ((((((s->left).clen != (int *)0x0 && ((s->right).cfront != (int *)0x0)) &&
            (((s->right).clen != (int *)0x0 &&
             ((s->stuff != (char *)0x0 && (s->bucket != (int *)0x0)))))) && (s->count != (int *)0x0)
           ) && ((((s->ccount != (int *)0x0 && (s->clist != (int *)0x0)) &&
                  (s->prevnon != (int *)0x0)) &&
                 ((s->start != (int *)0x0 && (s->gamma != (int *)0x0)))))))) &&
        ((((s->theta != (int *)0x0 &&
           (((s->left).unlab != (int *)0x0 && ((s->right).lab != (int *)0x0)))) &&
          (((s->right).unlab != (int *)0x0 &&
           (((((s->left).lab != (int *)0x0 && (s->splitvar != (int *)0x0)) &&
             (s->splitwho != (int *)0x0)) &&
            ((s->junk != (int *)0x0 && (s->splitfrom != (int *)0x0)))))))) &&
         ((s->splitlev != (int *)0x0 && ((s->thsize != (int *)0x0 && (s->unsupp != (int *)0x0)))))))
        ) && (((s->conncnts != (int *)0x0 &&
               (((s->anctar != (int *)0x0 && (s->diffmark != (char *)0x0)) &&
                (s->diffs != (int *)0x0)))) &&
              ((((s->indmark != (char *)0x0 && (s->thnext != (int *)0x0)) &&
                ((s->thprev != (int *)0x0 &&
                 ((s->threp != (int *)0x0 && (s->thfront != (int *)0x0)))))) &&
               ((s->pairs != (int *)0x0 &&
                (((((s->unpairs != (int *)0x0 && (s->diffnons != (int *)0x0)) &&
                   (s->undiffnons != (int *)0x0)) &&
                  ((s->difflev != (int *)0x0 && (s->undifflev != (int *)0x0)))) &&
                 (s->specmin != (int *)0x0)))))))))) {
      return s;
    }
    saucy_free(s);
  }
  return (saucy *)0x0;
}

Assistant:

struct saucy *
saucy_alloc(Abc_Ntk_t * pNtk)
{
    int i;
    int numouts = Abc_NtkPoNum(pNtk);
    int numins =  Abc_NtkPiNum(pNtk);
    int n = numins + numouts;
    struct saucy *s = ABC_ALLOC(struct saucy, 1);
    if (s == NULL) return NULL;

    s->ninduce = ints(n);
    s->sinduce = ints(n);
    s->indmark = bits(n);
    s->left.cfront = zeros(n);
    s->left.clen = ints(n);
    s->right.cfront = zeros(n);
    s->right.clen = ints(n);
    s->stuff = bits(n+1);
    s->bucket = ints(n+2);
    s->count = ints(n+1);
    s->ccount = zeros(n);
    s->clist = ints(n);
    s->nextnon = ints(n+1) + 1;
    s->prevnon = ints(n+1);
    s->anctar = ints(n);
    s->start = ints(n);
    s->gamma = ints(n);
    s->junk = ints(n);
    s->theta = ints(n);
    s->thsize = ints(n);
    s->left.lab = ints(n);
    s->left.unlab = ints(n);
    s->right.lab = ints(n);
    s->right.unlab = ints(n);
    s->splitvar = ints(n);
    s->splitwho = ints(n);
    s->splitfrom = ints(n);
    s->splitlev = ints(n+1);
    s->unsupp = ints(n);
    s->conncnts = zeros(n);
    s->diffmark = bits(n);
    s->diffs = ints(n);
    s->difflev = ints(n);
    s->undifflev = ints(n);
    s->specmin = ints(n);
    s->thnext = ints(n);
    s->thprev = ints(n);
    s->threp = ints(n);
    s->thfront = ints(n);
    s->pairs = ints(n);
    s->unpairs = ints(n);
    s->diffnons = ints(n);
    s->undiffnons = ints(n);
    s->marks = bits(n);

    s->iDep = ABC_ALLOC( Vec_Int_t*,  numins );
    s->oDep = ABC_ALLOC( Vec_Int_t*,  numouts );
    s->obs  = ABC_ALLOC( Vec_Int_t*,  numins );
    s->ctrl = ABC_ALLOC( Vec_Int_t*,  numouts );

    for(i = 0; i < numins; i++) {       
        s->iDep[i] = Vec_IntAlloc( 1 );
        s->obs[i] = Vec_IntAlloc( 1 );
    }
    for(i = 0; i < numouts; i++) {      
        s->oDep[i] = Vec_IntAlloc( 1 );
        s->ctrl[i] = Vec_IntAlloc( 1 );
    }   

    s->randomVectorArray_sim1 = Vec_PtrAlloc( n );  
    s->randomVectorSplit_sim1 = zeros( n );
    s->randomVectorArray_sim2 = Vec_PtrAlloc( n );  
    s->randomVectorSplit_sim2= zeros( n );

    s->satCounterExamples = Vec_PtrAlloc( 1 );
    s->pModel = ints( numins );

    if (s->ninduce && s->sinduce && s->left.cfront && s->left.clen
        && s->right.cfront && s->right.clen
        && s->stuff && s->bucket && s->count && s->ccount
        && s->clist && s->nextnon-1 && s->prevnon
        && s->start && s->gamma && s->theta && s->left.unlab
        && s->right.lab && s->right.unlab
        && s->left.lab &&  s->splitvar && s->splitwho && s->junk
        && s->splitfrom && s->splitlev && s->thsize
        && s->unsupp && s->conncnts && s->anctar
        && s->diffmark && s->diffs && s->indmark
        && s->thnext && s->thprev && s->threp && s->thfront
        && s->pairs && s->unpairs && s->diffnons && s->undiffnons
        && s->difflev && s->undifflev && s->specmin)
    {
        return s;
    }
    else {
        saucy_free(s);
        return NULL;
    }
}